

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O0

void __thiscall Win32MakefileGenerator::writeLibsPart(Win32MakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  QTextStream *pQVar2;
  QTextStream *this_00;
  QTextStream *pQVar3;
  QTextStream *this_01;
  QTextStream *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QTextStreamFunction in_stack_fffffffffffffc48;
  QTextStream *in_stack_fffffffffffffc50;
  QMakeProject *in_stack_fffffffffffffc58;
  QChar sep;
  ProKey *in_stack_fffffffffffffc60;
  QMakeEvaluator *in_stack_fffffffffffffc68;
  ProString *in_stack_fffffffffffffc70;
  ProKey *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  byte local_353;
  QChar local_33a [37];
  undefined1 local_2f0 [30];
  QChar local_2d2 [37];
  undefined1 local_288 [30];
  QChar local_26a [37];
  undefined1 local_220 [30];
  QChar local_202 [37];
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [48];
  undefined1 local_170 [24];
  undefined1 local_158 [48];
  undefined1 local_128 [24];
  undefined1 local_110 [48];
  undefined1 local_e0 [24];
  undefined1 local_c8 [48];
  undefined1 local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)in_stack_fffffffffffffc58,
                   (char *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_fffffffffffffc58,(QString *)in_stack_fffffffffffffc50,
                     SUB81((ulong)in_stack_fffffffffffffc48 >> 0x38,0));
  local_353 = 0;
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
    QMakeEvaluator::first(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    local_353 = ProString::operator==(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    ProString::~ProString((ProString *)0x2b7d4c);
    ProKey::~ProKey((ProKey *)0x2b7d62);
  }
  QString::~QString((QString *)0x2b7d6f);
  if ((local_353 & 1) == 0) {
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"LINKER        = ");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)pQVar2);
    (**(code **)(*in_RDI + 0xb0))(local_128,in_RDI,local_158);
    QTextStream::operator<<(pQVar2,(QString *)local_128);
    ::operator<<(in_stack_fffffffffffffc50,(QTextStreamFunction)pQVar2);
    QString::~QString((QString *)0x2b7efb);
    ProKey::~ProKey((ProKey *)0x2b7f08);
    this_00 = (QTextStream *)QTextStream::operator<<(in_RSI,"LFLAGS        = ");
    ProKey::ProKey((ProKey *)this_00,(char *)pQVar2);
    (**(code **)(*in_RDI + 0xb0))(local_170,in_RDI,local_1a0);
    QTextStream::operator<<(this_00,(QString *)local_170);
    ::operator<<(this_00,(QTextStreamFunction)pQVar2);
    QString::~QString((QString *)0x2b7f7e);
    ProKey::~ProKey((ProKey *)0x2b7f8b);
    pQVar3 = (QTextStream *)QTextStream::operator<<(in_RSI,"LIBS          = ");
    ProKey::ProKey((ProKey *)this_00,(char *)pQVar2);
    MakefileGenerator::fixLibFlags
              ((MakefileGenerator *)CONCAT17(local_353,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    QChar::QChar<char,_true>(local_202,' ');
    ProStringList::join((ProStringList *)pQVar2,(QChar)(char16_t)((ulong)pQVar3 >> 0x30));
    this_01 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)local_1b8);
    sep.ucs = (char16_t)((ulong)pQVar3 >> 0x30);
    pQVar3 = (QTextStream *)QTextStream::operator<<(this_01,' ');
    ProKey::ProKey((ProKey *)this_00,(char *)pQVar2);
    MakefileGenerator::fixLibFlags
              ((MakefileGenerator *)CONCAT17(local_353,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    QChar::QChar<char,_true>(local_26a,' ');
    ProStringList::join((ProStringList *)pQVar2,sep);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)local_220);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,' ');
    ProKey::ProKey((ProKey *)this_00,(char *)pQVar2);
    MakefileGenerator::fixLibFlags
              ((MakefileGenerator *)CONCAT17(local_353,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    QChar::QChar<char,_true>(local_2d2,' ');
    ProStringList::join((ProStringList *)pQVar2,sep);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)local_288);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,' ');
    ProKey::ProKey((ProKey *)this_00,(char *)pQVar2);
    MakefileGenerator::fixLibFlags
              ((MakefileGenerator *)CONCAT17(local_353,in_stack_fffffffffffffc88),
               in_stack_fffffffffffffc80);
    QChar::QChar<char,_true>(local_33a,' ');
    ProStringList::join((ProStringList *)pQVar2,sep);
    QTextStream::operator<<(pQVar3,(QString *)local_2f0);
    ::operator<<(this_00,(QTextStreamFunction)pQVar2);
    QString::~QString((QString *)0x2b81a9);
    ProStringList::~ProStringList((ProStringList *)0x2b81b6);
    ProKey::~ProKey((ProKey *)0x2b81c3);
    QString::~QString((QString *)0x2b81d0);
    ProStringList::~ProStringList((ProStringList *)0x2b81dd);
    ProKey::~ProKey((ProKey *)0x2b81ea);
    QString::~QString((QString *)0x2b81f7);
    ProStringList::~ProStringList((ProStringList *)0x2b8204);
    ProKey::~ProKey((ProKey *)0x2b8211);
    QString::~QString((QString *)0x2b821e);
    ProStringList::~ProStringList((ProStringList *)0x2b822b);
    ProKey::~ProKey((ProKey *)0x2b8238);
  }
  else {
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"LIBAPP        = ");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
    (**(code **)(*in_RDI + 0xb0))(local_98,in_RDI,local_c8);
    QTextStream::operator<<(pQVar2,(QString *)local_98);
    ::operator<<(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    QString::~QString((QString *)0x2b7df2);
    ProKey::~ProKey((ProKey *)0x2b7dff);
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"LIBFLAGS      = ");
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48);
    (**(code **)(*in_RDI + 0xb0))(local_e0,in_RDI,local_110);
    QTextStream::operator<<(pQVar2,(QString *)local_e0);
    ::operator<<(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    QString::~QString((QString *)0x2b7e75);
    ProKey::~ProKey((ProKey *)0x2b7e82);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeLibsPart(QTextStream &t)
{
    if(project->isActiveConfig("staticlib") && project->first("TEMPLATE") == "lib") {
        t << "LIBAPP        = " << var("QMAKE_LIB") << Qt::endl;
        t << "LIBFLAGS      = " << var("QMAKE_LIBFLAGS") << Qt::endl;
    } else {
        t << "LINKER        = " << var("QMAKE_LINK") << Qt::endl;
        t << "LFLAGS        = " << var("QMAKE_LFLAGS") << Qt::endl;
        t << "LIBS          = " << fixLibFlags("LIBS").join(' ') << ' '
                                << fixLibFlags("LIBS_PRIVATE").join(' ') << ' '
                                << fixLibFlags("QMAKE_LIBS").join(' ') << ' '
                                << fixLibFlags("QMAKE_LIBS_PRIVATE").join(' ') << Qt::endl;
    }
}